

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O0

HighsDebugStatus
debugHighsSolution(string *message,HighsOptions *options,HighsLp *lp,HighsHessian *hessian,
                  HighsSolution *solution,HighsBasis *basis,HighsModelStatus model_status,
                  HighsInfo *highs_info,bool check_model_status_and_highs_info)

{
  const_reference pvVar1;
  reference pvVar2;
  HighsLogOptions *log_options_;
  undefined8 uVar3;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  HighsLogOptions *in_RDI;
  byte *in_R8;
  int in_stack_00000008;
  byte in_stack_00000018;
  bool error_found;
  HighsInt *num_dual_infeasibility;
  HighsInt *num_primal_infeasibility;
  HighsInt iCol;
  vector<double,_std::allocator<double>_> gradient;
  bool get_residuals;
  HighsPrimalDualErrors primal_dual_errors;
  double local_objective_function_value;
  HighsInfo local_highs_info;
  HighsModelStatus local_model_status;
  HighsDebugStatus return_status;
  size_type in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  HighsOptions *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  uint uVar5;
  HighsLp *in_stack_fffffffffffffd40;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd50;
  value_type vVar6;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd58;
  HighsModelStatus model_status_00;
  HighsInfo *in_stack_fffffffffffffd60;
  HighsHessian *in_stack_fffffffffffffd70;
  string local_270 [8];
  HighsPrimalDualErrors *in_stack_fffffffffffffd98;
  HighsOptions *in_stack_fffffffffffffda0;
  string local_250 [35];
  byte local_22d;
  undefined4 local_22c;
  uint *local_228;
  uint *local_220;
  HighsModelStatus model_status_01;
  vector<double,_std::allocator<double>_> local_208;
  undefined1 local_1e9;
  double local_108;
  double local_c8;
  uint local_a8 [6];
  uint local_90 [19];
  int local_44;
  HighsDebugStatus local_40;
  byte local_39;
  byte *local_30;
  int *local_28;
  int *local_20;
  long local_18;
  HighsDebugStatus local_4;
  
  local_39 = in_stack_00000018 & 1;
  if (*(int *)(in_RSI + 0x15c) < 1) {
    return kNotChecked;
  }
  local_44 = 0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  HighsInfo::HighsInfo((HighsInfo *)in_stack_fffffffffffffd30);
  if ((local_39 & 1) != 0) {
    local_108 = 0.0;
    if ((*local_30 & 1) != 0) {
      in_stack_fffffffffffffd60 =
           (HighsInfo *)
           HighsLp::objectiveValue
                     (in_stack_fffffffffffffd40,
                      (vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      in_stack_fffffffffffffd58 =
           (vector<double,_std::allocator<double>_> *)
           HighsHessian::objectiveValue
                     (in_stack_fffffffffffffd70,(vector<double,_std::allocator<double>_> *)in_RDI);
      local_108 = (double)in_stack_fffffffffffffd60 + (double)in_stack_fffffffffffffd58;
    }
    local_c8 = local_108;
  }
  local_1e9 = 1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x52a3b9);
  if (*local_28 < 1) {
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               in_stack_fffffffffffffd18,(value_type_conflict1 *)0x52a430);
  }
  else {
    HighsHessian::product
              ((HighsHessian *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               in_stack_fffffffffffffd50);
  }
  for (model_status_01 = kMin;
      model_status_00 = (HighsModelStatus)((ulong)in_stack_fffffffffffffd58 >> 0x20),
      (int)model_status_01 < *local_20; model_status_01 = model_status_01 + kLoadError) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_20 + 2),
                        (long)(int)model_status_01);
    vVar6 = *pvVar1;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&local_208,(long)(int)model_status_01);
    *pvVar2 = vVar6 + *pvVar2;
  }
  uVar4 = 1;
  getKktFailures((HighsOptions *)primal_dual_errors._64_8_,
                 (HighsLp *)primal_dual_errors.sum_primal_residual,
                 (vector<double,_std::allocator<double>_> *)primal_dual_errors._48_8_,
                 (HighsSolution *)primal_dual_errors.sum_off_bound_nonbasic,
                 (HighsBasis *)primal_dual_errors.max_off_bound_nonbasic,
                 (HighsInfo *)primal_dual_errors._24_8_,
                 (HighsPrimalDualErrors *)primal_dual_errors.max_primal_residual.absolute_value,
                 primal_dual_errors.sum_nonzero_basic_duals._7_1_);
  local_220 = local_a8;
  local_228 = local_90;
  if ((local_39 & 1) == 0) {
    if ((local_a8[0] == 0) && (local_90[0] == 0)) {
      local_44 = 7;
    }
  }
  else {
    local_44 = in_stack_00000008;
    local_40 = debugCompareHighsInfo
                         (in_stack_fffffffffffffd30,
                          (HighsInfo *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                          ,(HighsInfo *)CONCAT44(in_stack_fffffffffffffd24,uVar4));
    local_4 = local_40;
    if (local_40 != kOk) goto LAB_0052a809;
  }
  if (((local_39 & 1) != 0) && (in_stack_00000008 == 7)) {
    local_22d = 0;
    if (0 < (int)*local_220) {
      local_22d = 1;
      log_options_ = (HighsLogOptions *)(local_18 + 0x380);
      uVar5 = *local_220;
      utilModelStatusToString_abi_cxx11_(model_status_01);
      uVar3 = std::__cxx11::string::c_str();
      highsLogDev(log_options_,kError,
                  "debugHighsLpSolution: %d primal infeasibilities but model status is %s\n",
                  (ulong)uVar5,uVar3);
      std::__cxx11::string::~string(local_250);
    }
    if (0 < (int)*local_228) {
      local_22d = 1;
      in_stack_fffffffffffffd30 = (HighsOptions *)(local_18 + 0x380);
      uVar5 = *local_228;
      utilModelStatusToString_abi_cxx11_(model_status_01);
      uVar3 = std::__cxx11::string::c_str();
      highsLogDev((HighsLogOptions *)in_stack_fffffffffffffd30,kError,
                  "debugHighsLpSolution: %d dual infeasibilities but model status is %s\n",
                  (ulong)uVar5,uVar3);
      std::__cxx11::string::~string(local_270);
    }
    if ((local_22d & 1) != 0) {
      local_4 = kLogicalError;
      goto LAB_0052a809;
    }
  }
  std::__cxx11::string::string((string *)&stack0xfffffffffffffd70,(string *)in_RDI);
  debugReportHighsSolution
            ((string *)in_stack_fffffffffffffd70,in_RDI,in_stack_fffffffffffffd60,model_status_00);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd70);
  local_40 = debugAnalysePrimalDualErrors(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  local_4 = local_40;
LAB_0052a809:
  local_22c = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd30);
  HighsInfo::~HighsInfo((HighsInfo *)CONCAT44(in_stack_fffffffffffffd24,uVar4));
  return local_4;
}

Assistant:

HighsDebugStatus debugHighsSolution(
    const std::string message, const HighsOptions& options, const HighsLp& lp,
    const HighsHessian& hessian, const HighsSolution& solution,
    const HighsBasis& basis, const HighsModelStatus model_status,
    const HighsInfo& highs_info, const bool check_model_status_and_highs_info) {
  // Non-trivially expensive analysis of a solution to a model
  //
  // Called to possibly check the model_status and highs_info,
  // and then report on the KKT and model status, plus any errors
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status;
  // Use local_model_status to for checking - or if it's not known
  HighsModelStatus local_model_status = HighsModelStatus::kNotset;
  // Use local_highs_info to determine highs_info for
  // checking - or if it's not known
  HighsInfo local_highs_info;
  if (check_model_status_and_highs_info) {
    double local_objective_function_value = 0;
    if (solution.value_valid)
      local_objective_function_value =
          lp.objectiveValue(solution.col_value) +
          hessian.objectiveValue(solution.col_value);
    local_highs_info.objective_function_value = local_objective_function_value;
  }
  HighsPrimalDualErrors primal_dual_errors;
  // Determine the extent to which KKT conditions are not satisfied,
  // accumulating data on primal/dual errors relating to any basis
  // implications and excessive residuals
  const bool get_residuals =
      true;  // options.highs_debug_level >= kHighsDebugLevelCostly;

  vector<double> gradient;
  if (hessian.dim_ > 0) {
    hessian.product(solution.col_value, gradient);
  } else {
    gradient.assign(lp.num_col_, 0);
  }
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
    gradient[iCol] += lp.col_cost_[iCol];
  getKktFailures(options, lp, gradient, solution, basis, local_highs_info,
                 primal_dual_errors, get_residuals);
  HighsInt& num_primal_infeasibility =
      local_highs_info.num_primal_infeasibilities;
  HighsInt& num_dual_infeasibility = local_highs_info.num_dual_infeasibilities;
  if (check_model_status_and_highs_info) {
    // Can assume that model_status and highs_info are known, so should be
    // checked
    local_model_status = model_status;
    // Check that highs_info is the same as when computed from scratch
    return_status =
        debugCompareHighsInfo(options, highs_info, local_highs_info);
    if (return_status != HighsDebugStatus::kOk) return return_status;
  } else {
    // Determine whether optimality can be reported
    if (num_primal_infeasibility == 0 && num_dual_infeasibility == 0)
      local_model_status = HighsModelStatus::kOptimal;
  }
  if (check_model_status_and_highs_info &&
      model_status == HighsModelStatus::kOptimal) {
    bool error_found = false;
    if (num_primal_infeasibility > 0) {
      error_found = true;
      highsLogDev(options.log_options, HighsLogType::kError,
                  "debugHighsLpSolution: %" HIGHSINT_FORMAT
                  " primal infeasibilities but model status is %s\n",
                  num_primal_infeasibility,
                  utilModelStatusToString(model_status).c_str());
    }
    if (num_dual_infeasibility > 0) {
      error_found = true;
      highsLogDev(options.log_options, HighsLogType::kError,
                  "debugHighsLpSolution: %" HIGHSINT_FORMAT
                  " dual infeasibilities but model status is %s\n",
                  num_dual_infeasibility,
                  utilModelStatusToString(model_status).c_str());
    }
    if (error_found) return HighsDebugStatus::kLogicalError;
  }
  // Report on the solution
  debugReportHighsSolution(message, options.log_options, local_highs_info,
                           local_model_status);
  // Analyse the primal and dual errors
  return_status = debugAnalysePrimalDualErrors(options, primal_dual_errors);
  return return_status;
}